

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::
ConcreteMachine(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this,Target *target
               ,ROMFetcher *rom_fetcher)

{
  uint8_t *puVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  pointer ppVar5;
  pointer __dest;
  uchar *__src;
  unsigned_long *puVar6;
  Joystick *pJVar7;
  State *this_00;
  Video<(Sinclair::ZXSpectrum::Video::Timing)0> *target_00;
  reference pvVar8;
  reference __src_00;
  ulong local_128;
  size_t c;
  unsigned_long local_118;
  ulong local_110;
  size_t num_banks;
  State *state;
  Joystick *local_f8;
  Joystick *local_f0;
  size_type local_e8;
  size_type local_e0;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rom;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  Name rom_name;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  Activity::Source::Source(&this->super_Source);
  ClockingHint::Observer::Observer(&this->super_Observer);
  Configurable::Device::Device(&this->super_Device);
  ZXSpectrum::Machine::Machine(&this->super_Machine);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  rom_name = AcornElectronMOS100;
  Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
  TypeRecipient<Sinclair::ZX::Keyboard::Machine>
            (&this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>,&rom_name);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_00ca6d98;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00ca6e68;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca6e80;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca6ea0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca6ed0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca6ee8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca6f00;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca6f30;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca6f70;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca6f88;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca6fc0;
  (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).super_Delegate.
  super_KeyActions._vptr_KeyActions = (_func_int **)&PTR_set_key_state_00ca7008;
  CPU::Z80::
  Processor<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>,_false,_false>
  ::Processor(&this->z80_,this);
  this->port1ffd_ = '\0';
  this->port7ffd_ = '\0';
  this->disable_paging_ = false;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  GI::AY38910::AY38910<false>::AY38910SampleSource(&this->ay_,AY38910,&this->audio_queue_);
  Audio::Toggle::Toggle(&this->audio_toggle_,&this->audio_queue_);
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>::CompoundSource
            (&this->mixer_,&this->ay_,&this->audio_toggle_);
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>::
  PullLowpass(&this->speaker_,&this->mixer_);
  HalfCycles::HalfCycles(&this->time_since_audio_update_);
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>
  ::JustInTimeActor<>(&this->video_);
  ZX::Keyboard::Keyboard::Keyboard(&this->keyboard_,ZXSpectrum);
  ZX::Keyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_,ZXSpectrum);
  uVar3 = clock_rate();
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&this->tape_player_,uVar3 * 2);
  this->tape_player_is_sleeping_ = false;
  this->use_automatic_tape_motor_control_ = true;
  HalfCycles::HalfCycles(&this->cycles_since_tape_input_read_);
  this->recent_tape_hits_ = 0;
  this->allow_fast_tape_hack_ = false;
  this->use_fast_tape_hack_ = false;
  uVar3 = clock_rate();
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar3 * 2;
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::JustInTimeActor<unsigned_int>
            (&this->fdc_,
             (uint *)((long)&request.node.children.
                             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  Cycles::Cycles(&this->duration_to_press_enter_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::vector(&this->joysticks_);
  uVar3 = clock_rate();
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,(double)uVar3);
  uVar3 = clock_rate();
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
                   ,(float)uVar3 * 0.5);
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 100;
  ROM::Request::Request
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,Spectrum48k,false);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&rom,local_20,(Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar2 = ROM::Request::validate
                    ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,(Map *)&rom);
  if (bVar2) {
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&rom,(key_type *)
                        &request.node.children.
                         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_d8);
    local_d0 = &ppVar5->second;
    __dest = std::array<unsigned_char,_65536UL>::data(&this->rom_);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d0);
    local_e0 = std::array<unsigned_char,_65536UL>::size(&this->rom_);
    local_e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d0);
    puVar6 = std::min<unsigned_long>(&local_e0,&local_e8);
    memcpy(__dest,__src,*puVar6);
    ClockingHint::Source::set_clocking_hint_observer
              (&(this->tape_player_).super_TapePlayer.super_Source,&this->super_Observer);
    pJVar7 = (Joystick *)operator_new(0x48);
    anon_unknown.dwarf_cb49ff::Joystick::Joystick(pJVar7);
    local_f0 = pJVar7;
    std::
    vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
    ::emplace_back<(anonymous_namespace)::Joystick*>
              ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
                *)&this->joysticks_,&local_f0);
    pJVar7 = (Joystick *)operator_new(0x48);
    anon_unknown.dwarf_cb49ff::Joystick::Joystick(pJVar7);
    local_f8 = pJVar7;
    std::
    vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
    ::emplace_back<(anonymous_namespace)::Joystick*>
              ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
                *)&this->joysticks_,&local_f8);
    update_memory_map(this);
    set_video_address(this);
    Memory::Fuzz<std::array<unsigned_char,131072ul>>(&this->ram_);
    (*(this->super_Source)._vptr_Source[0x10])(this,&rom_fetcher_local->_M_invoker);
    if ((rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[0xc] & 1U) != 0) {
      uVar3 = clock_rate();
      Cycles::Cycles((Cycles *)&state,(ulong)(uVar3 * 5));
      (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = (IntType)state;
      ZX::Keyboard::Keyboard::set_key_state(&this->keyboard_,0x601,true);
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)
                       ((rom_fetcher_local->super__Function_base)._M_functor._M_pod_data + 8));
    if (bVar2) {
      num_banks = (size_t)std::
                          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>::
                          get((unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>
                               *)((long)&(rom_fetcher_local->super__Function_base)._M_functor + 8));
      CPU::Z80::State::apply((State *)(num_banks + 8),&(this->z80_).super_ProcessorBase);
      this_00 = (State *)(num_banks + 0x78);
      target_00 = JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>
                  ::last_valid(&this->video_);
      ZXSpectrum::Video::State::
      apply<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>>
                (this_00,target_00);
      GI::AY38910::State::apply<GI::AY38910::AY38910<false>>((State *)(num_banks + 0xb8),&this->ay_)
      ;
      local_118 = 0xc000;
      c = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(num_banks + 0x98));
      puVar6 = std::min<unsigned_long>(&local_118,&c);
      local_110 = *puVar6 >> 0xe;
      for (local_128 = 0; local_128 < local_110; local_128 = local_128 + 1) {
        pvVar8 = std::
                 array<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::Bank,_4UL>
                 ::operator[](&this->banks_,local_128 + 1);
        puVar1 = pvVar8->write;
        __src_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (num_banks + 0x98),local_128 << 0xe);
        memcpy(puVar1 + (local_128 + 1) * 0x4000,__src_00,0x4000);
      }
    }
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)&rom);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::ZXSpectrum::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			Utility::TypeRecipient<CharacterMapper>(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			z80_(*this),
			ay_(GI::AY38910::Personality::AY38910, audio_queue_),
			audio_toggle_(audio_queue_),
			mixer_(ay_, audio_toggle_),
			speaker_(mixer_),
			keyboard_(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			keyboard_mapper_(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			tape_player_(clock_rate() * 2),
			fdc_(clock_rate() * 2)
		{
			set_clock_rate(clock_rate());
			speaker_.set_input_rate(float(clock_rate()) / 2.0f);

			ROM::Name rom_name;
			switch(model) {
				case Model::SixteenK:
				case Model::FortyEightK:	rom_name = ROM::Name::Spectrum48k;		break;
				case Model::OneTwoEightK:	rom_name = ROM::Name::Spectrum128k;		break;
				case Model::Plus2:			rom_name = ROM::Name::SpecrumPlus2;		break;
				case Model::Plus2a:
				case Model::Plus3:			rom_name = ROM::Name::SpectrumPlus3;	break;
				// TODO: possibly accept the +3 ROM in multiple parts?
			}
			const auto request = ROM::Request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			const auto &rom = roms.find(rom_name)->second;
			memcpy(rom_.data(), rom.data(), std::min(rom_.size(), rom.size()));

			// Register for sleeping notifications.
			tape_player_.set_clocking_hint_observer(this);

			// Attach a couple of joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);

			// Set up initial memory map.
			update_memory_map();
			set_video_address();
			Memory::Fuzz(ram_);

			// Insert media.
			insert_media(target.media);

			// Possibly depress the enter key.
			if(target.should_hold_enter) {
				// Hold it for five seconds, more or less.
				duration_to_press_enter_ = Cycles(5 * clock_rate());
				keyboard_.set_key_state(ZX::Keyboard::KeyEnter, true);
			}

			// Install state if supplied.
			if(target.state) {
				const auto state = static_cast<State *>(target.state.get());
				state->z80.apply(z80_);
				state->video.apply(*video_.last_valid());
				state->ay.apply(ay_);

				// If this is a 48k or 16k machine, remap source data from its original
				// linear form to whatever the banks end up being; otherwise copy as is.
				if(model <= Model::FortyEightK) {
					const size_t num_banks = std::min(size_t(48*1024), state->ram.size()) >> 14;
					for(size_t c = 0; c < num_banks; c++) {
						memcpy(&banks_[c + 1].write[(c+1) * 0x4000], &state->ram[c * 0x4000], 0x4000);
					}
				} else {
					memcpy(ram_.data(), state->ram.data(), std::min(ram_.size(), state->ram.size()));

					port1ffd_ = state->last_1ffd;
					port7ffd_ = state->last_7ffd;
					update_memory_map();
				}
			}
		}